

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *ref_pos_00;
  ImGuiPopupPositionPolicy policy;
  ImGuiContext *g;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 ref_pos;
  ImRect r_outer;
  ImRect local_58;
  ImVec2 local_40;
  ImRect local_38;
  undefined1 local_28 [16];
  
  pIVar4 = GImGui;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar5 = IVar1.x;
  fVar7 = IVar1.y;
  IVar1 = (GImGui->IO).DisplaySize;
  fVar6 = IVar1.x;
  fVar8 = IVar1.y;
  local_38.Max.x = (float)((uint)-fVar5 & -(uint)(fVar5 + fVar5 < fVar6));
  local_38.Max.y = (float)((uint)-fVar7 & -(uint)(fVar7 + fVar7 < fVar8));
  local_38.Min.x = 0.0 - local_38.Max.x;
  local_38.Min.y = 0.0 - local_38.Max.y;
  local_38.Max.x = local_38.Max.x + fVar6;
  local_38.Max.y = local_38.Max.y + fVar8;
  uVar2 = window->Flags;
  if ((uVar2 >> 0x1c & 1) == 0) {
    if ((uVar2 >> 0x1a & 1) != 0) {
      fVar5 = (window->Pos).x;
      fVar7 = (window->Pos).y;
      local_58.Min.y = fVar7 + -1.0;
      local_58.Min.x = fVar5 + -1.0;
      local_58.Max.y = fVar7 + 1.0;
      local_58.Max.x = fVar5 + 1.0;
      goto LAB_00128f50;
    }
    if ((uVar2 >> 0x19 & 1) == 0) {
      fVar5 = (window->Pos).x;
      fVar7 = (window->Pos).y;
      goto LAB_00128f6b;
    }
    local_28 = ZEXT416((uint)(GImGui->Style).MouseCursorScale);
    local_40 = NavCalcPreferredRefPos();
    if (((pIVar4->NavDisableHighlight == false) && (pIVar4->NavDisableMouseHover == true)) &&
       (((pIVar4->IO).ConfigFlags & 4) == 0)) {
      fVar7 = 16.0;
      fVar5 = 8.0;
    }
    else {
      fVar7 = (float)local_28._0_4_ * 24.0;
      fVar5 = fVar7;
    }
    local_58.Min.y = local_40.y + -8.0;
    local_58.Min.x = local_40.x + -16.0;
    local_58.Max.y = fVar5 + local_40.y;
    local_58.Max.x = fVar7 + local_40.x;
    ref_pos_00 = &local_40;
    policy = ImGuiPopupPositionPolicy_Tooltip;
  }
  else {
    pIVar3 = (GImGui->CurrentWindowStack).Data[(long)(GImGui->CurrentWindowStack).Size + -2];
    if ((pIVar3->DC).MenuBarAppending == true) {
      local_58.Min.y = (pIVar3->ClipRect).Min.y;
      local_58.Max.y = (pIVar3->ClipRect).Max.y;
      local_58.Max.x = 3.4028235e+38;
      local_58.Min.x = -3.4028235e+38;
    }
    else {
      fVar5 = (GImGui->Style).ItemInnerSpacing.x;
      fVar7 = (pIVar3->Pos).x;
      local_58.Min.x = fVar5 + fVar7;
      local_58.Max.x = ((fVar7 + (pIVar3->Size).x) - fVar5) - (pIVar3->ScrollbarSizes).x;
      local_58.Max.y = 3.4028235e+38;
      local_58.Min.y = -3.4028235e+38;
    }
LAB_00128f50:
    ref_pos_00 = &window->Pos;
    policy = ImGuiPopupPositionPolicy_Default;
  }
  IVar1 = FindBestWindowPosForPopupEx
                    (ref_pos_00,&window->Size,&window->AutoPosLastDirection,&local_38,&local_58,
                     policy);
  fVar5 = IVar1.x;
  fVar7 = IVar1.y;
LAB_00128f6b:
  IVar1.y = fVar7;
  IVar1.x = fVar5;
  return IVar1;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}